

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_InstantiateFunctionListItem2(JSContext *ctx,JSObject *p,JSAtom atom,void *opaque)

{
  char cVar1;
  JSValue JVar2;
  
  cVar1 = *(char *)((long)opaque + 9);
  if (cVar1 == '\b') {
    JVar2 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
    JS_SetPropertyFunctionList
              (ctx,JVar2,*(JSCFunctionListEntry **)((long)opaque + 0x10),
               *(int *)((long)opaque + 0x18));
  }
  else {
    if (cVar1 == '\x03') {
      JVar2 = JS_NewAtomString(ctx,*(char **)((long)opaque + 0x10));
      return JVar2;
    }
    if (cVar1 != '\0') {
      abort();
    }
    JVar2 = JS_NewCFunction3(ctx,*(JSCFunction **)((long)opaque + 0x18),*opaque,
                             (uint)*(byte *)((long)opaque + 0x10),
                             (uint)*(byte *)((long)opaque + 0x11),(int)*(short *)((long)opaque + 10)
                             ,ctx->function_proto);
  }
  return JVar2;
}

Assistant:

static JSValue JS_InstantiateFunctionListItem2(JSContext *ctx, JSObject *p,
                                               JSAtom atom, void *opaque)
{
    const JSCFunctionListEntry *e = opaque;
    JSValue val;

    switch(e->def_type) {
    case JS_DEF_CFUNC:
        val = JS_NewCFunction2(ctx, e->u.func.cfunc.generic,
                               e->name, e->u.func.length, e->u.func.cproto, e->magic);
        break;
    case JS_DEF_PROP_STRING:
        val = JS_NewAtomString(ctx, e->u.str);
        break;
    case JS_DEF_OBJECT:
        val = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, val, e->u.prop_list.tab, e->u.prop_list.len);
        break;
    default:
        abort();
    }
    return val;
}